

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O3

int add_float_attr(attr_list list,atom_t attr_id,double fvalue)

{
  undefined8 in_R8;
  attr_union value;
  
  value.u.l._4_4_ = 0;
  value.u.f = (float)fvalue;
  value.u.o.buffer = (void *)in_R8;
  add_pattr(list,attr_id,Attr_Float4,value);
  return 1;
}

Assistant:

extern int
add_float_attr(attr_list list, atom_t attr_id, double fvalue)
{
    attr_value_type t = Attr_Float4;
    attr_union tmp;
    tmp.u.f = (float) fvalue;
    if (sizeof(float) == 8) t = Attr_Float8;
    if (sizeof(float) == 16) t = Attr_Float16;
    return add_pattr(list, attr_id, t, tmp);
}